

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

bool __thiscall capnproto_test::capnp::test::TestOldVersion::Reader::hasOld2(Reader *this)

{
  bool bVar1;
  uint ptrIndex;
  PointerReader local_30;
  Reader *local_10;
  Reader *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<0u>();
  ::capnp::_::StructReader::getPointerField(&local_30,&this->_reader,ptrIndex);
  bVar1 = ::capnp::_::PointerReader::isNull(&local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

inline bool TestOldVersion::Reader::hasOld2() const {
  return !_reader.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS).isNull();
}